

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O3

bool __thiscall IntElemBoundsImp<0,_4,_0>::propagate(IntElemBoundsImp<0,_4,_0> *this)

{
  byte bVar1;
  IntView<0> *pIVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  Clause *pCVar7;
  IntVar *pIVar8;
  long lVar9;
  anon_union_8_2_743a5d44_for_Reason_0 aVar10;
  ulong uVar11;
  Lit p;
  long lVar12;
  IntVar *pIVar13;
  IntView<0> *pIVar14;
  ulong uVar15;
  bool bVar16;
  int64_t m_v;
  ulong uVar17;
  bool bVar18;
  anon_union_8_2_743a5d44_for_Reason_0 aVar19;
  anon_union_8_2_743a5d44_for_Reason_0 unaff_R15;
  initializer_list<Lit> __l;
  initializer_list<Lit> __l_00;
  initializer_list<Lit> __l_01;
  initializer_list<Lit> __l_02;
  initializer_list<Lit> __l_03;
  initializer_list<Lit> __l_04;
  initializer_list<Lit> __l_05;
  initializer_list<Lit> __l_06;
  Clause *c;
  vector<Lit,_std::allocator<Lit>_> expl;
  allocator_type local_131;
  anon_union_8_2_743a5d44_for_Reason_0 local_130;
  vector<Lit,_std::allocator<Lit>_> local_128;
  vector<Lit,_std::allocator<Lit>_> local_108;
  vector<Lit,_std::allocator<Lit>_> local_f0;
  vector<Lit,_std::allocator<Lit>_> local_d8;
  vector<Lit,_std::allocator<Lit>_> local_c0;
  vector<Lit,_std::allocator<Lit>_> local_a8;
  vector<Lit,_std::allocator<Lit>_> local_90;
  vector<Lit,_std::allocator<Lit>_> local_78;
  vector<Lit,_std::allocator<Lit>_> local_60;
  vector<Lit,_std::allocator<Lit>_> local_48;
  
  uVar5 = (this->b).v;
  bVar1 = sat.assigns.data[uVar5];
  if ((char)bVar1 == 0) {
    if ((this->is_fixed).v == '\0') {
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (Lit *)0x0;
      bVar18 = false;
      bVar16 = false;
      uVar5 = 0;
      do {
        uVar17 = (ulong)uVar5;
        lVar6 = (long)(this->x).b;
        lVar12 = uVar17 - lVar6;
        pIVar8 = (this->x).var;
        if (((lVar12 < (pIVar8->min).v) || (lVar9 = (long)(pIVar8->max).v, lVar9 < lVar12)) ||
           ((pIVar8->vals != (Tchar *)0x0 && (pIVar8->vals[lVar12].v == '\0')))) {
          iVar4 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[0xd])(pIVar8,lVar12,1);
          local_130._a._0_4_ = iVar4;
          if (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<Lit>
                      (&local_128,
                       (iterator)
                       local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                       super__Vector_impl_data._M_finish,(Lit *)&local_130);
          }
          else {
            (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data
            ._M_finish)->x = iVar4;
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          pIVar8 = (this->y).var;
          unaff_R15._pt = (Clause *)0x0;
          pIVar13 = (this->a).data[uVar17].var;
          if ((pIVar8->max).v < (pIVar13->min).v) {
            if (!bVar16) {
              iVar4 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[9])(pIVar8);
              local_130._a._0_4_ = iVar4;
              if (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<Lit>
                          (&local_128,
                           (iterator)
                           local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                           super__Vector_impl_data._M_finish,(Lit *)&local_130);
              }
              else {
                (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                 super__Vector_impl_data._M_finish)->x = iVar4;
                local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              pIVar13 = (this->a).data[uVar17].var;
            }
            iVar4 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[8])();
            local_130._a._0_4_ = iVar4;
            if (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<Lit>
                        (&local_128,
                         (iterator)
                         local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                         super__Vector_impl_data._M_finish,(Lit *)&local_130);
            }
            else {
              (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
               super__Vector_impl_data._M_finish)->x = iVar4;
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            bVar16 = true;
          }
          else {
            if ((pIVar8->min).v <= (pIVar13->max).v) goto LAB_001a12f5;
            if (!bVar18) {
              iVar4 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[8])(pIVar8);
              local_130._a._0_4_ = iVar4;
              if (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<Lit>
                          (&local_128,
                           (iterator)
                           local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                           super__Vector_impl_data._M_finish,(Lit *)&local_130);
              }
              else {
                (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                 super__Vector_impl_data._M_finish)->x = iVar4;
                local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              pIVar13 = (this->a).data[uVar17].var;
            }
            iVar4 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[9])();
            local_130._a._0_4_ = iVar4;
            if (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<Lit,_std::allocator<Lit>_>::_M_realloc_insert<Lit>
                        (&local_128,
                         (iterator)
                         local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                         super__Vector_impl_data._M_finish,(Lit *)&local_130);
            }
            else {
              (local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
               super__Vector_impl_data._M_finish)->x = iVar4;
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            bVar18 = true;
          }
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 <= (this->a).sz);
      lVar9 = (long)(((this->x).var)->max).v;
      lVar6 = (long)(this->x).b;
      uVar17 = (ulong)uVar5;
LAB_001a12f5:
      if (lVar6 + lVar9 < (long)uVar17) {
        std::vector<Lit,_std::allocator<Lit>_>::vector(&local_108,&local_128);
        iVar4 = (int)((ulong)((long)local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2) + 1;
        local_130._pt = (Clause *)malloc((long)iVar4 * 4 + 8);
        *(uint *)local_130._pt = iVar4 * 0x100 | 2;
        vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_130._pt);
        aVar10 = local_130;
        if ((long)local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_start == 0) {
          if (local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_finish != (pointer)0x0) goto LAB_001a1a9c;
        }
        else {
          lVar12 = (long)local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2;
          uVar5 = *(uint *)local_130._pt;
          uVar11 = 0;
          do {
            if (((uVar5 >> 8) - 1) + (uint)(uVar5 >> 8 == 0) == uVar11) goto LAB_001a21ad;
            *(int *)(local_130._a + 8 + uVar11 * 4) =
                 local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar11].x;
            uVar11 = uVar11 + 1;
          } while (lVar12 + (ulong)(lVar12 == 0) != uVar11);
LAB_001a1a9c:
          operator_delete(local_108.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        SAT::cEnqueue(&sat,(Lit)(((this->b).s ^ 1) + (this->b).v * 2),(Reason)aVar10);
        unaff_R15._a._1_7_ = 0;
        unaff_R15._a._0_1_ = sat.confl == (Clause *)0x0;
      }
      if ((IntElemBoundsImp<0,_4,_0> *)
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start != (IntElemBoundsImp<0,_4,_0> *)0x0) {
        operator_delete(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (lVar6 + lVar9 < (long)uVar17) goto LAB_001a218e;
      goto LAB_001a1ae5;
    }
LAB_001a13c4:
    iVar4 = (this->fixed_index).v;
    lVar6 = (long)iVar4;
    if ((-1 < lVar6) && (iVar4 < (int)(this->a).sz)) {
      pIVar2 = (this->a).data;
      pIVar14 = pIVar2 + lVar6;
      pIVar8 = pIVar2[lVar6].var;
      iVar4 = (pIVar8->min).v;
      if (bVar1 != 0) {
        pIVar13 = (this->y).var;
        iVar3 = (pIVar13->min).v;
        if (iVar4 <= iVar3) {
LAB_001a1bce:
          if (iVar4 < iVar3) {
            if (so.lazy == true) {
              uVar5 = (this->b).v;
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,
                                     (uint)((int)sat.assigns.data[uVar5] - 1U < 0xfffffffd) +
                                     uVar5 * 2);
              iVar4 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[8])();
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(iVar4,local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                           _M_impl.super__Vector_impl_data._M_start._0_4_);
              iVar4 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                     .super__Vector_impl_data._M_finish._4_4_,iVar4);
              __l_04._M_len = 3;
              __l_04._M_array = (iterator)&local_128;
              std::vector<Lit,_std::allocator<Lit>_>::vector(&local_60,__l_04,&local_131);
              iVar4 = (int)((ulong)((long)local_60.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_60.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                         _M_impl.super__Vector_impl_data._M_start) >> 2) + 1;
              local_130._pt = (Clause *)malloc((long)iVar4 * 4 + 8);
              *(uint *)local_130._pt = iVar4 * 0x100 | 2;
              vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_130._pt);
              aVar10 = local_130;
              if ((long)local_60.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_60.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                        super__Vector_impl_data._M_start == 0) {
                if (local_60.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                    super__Vector_impl_data._M_finish != (pointer)0x0) goto LAB_001a1cef;
              }
              else {
                lVar6 = (long)local_60.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_60.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2;
                uVar5 = *(uint *)local_130._pt;
                uVar17 = 0;
                do {
                  if (((uVar5 >> 8) - 1) + (uint)(uVar5 >> 8 == 0) == uVar17) goto LAB_001a21ad;
                  ((Clause *)(local_130._a + 8))->data[uVar17 - 1].x =
                       local_60.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar17].x;
                  uVar17 = uVar17 + 1;
                } while (lVar6 + (ulong)(lVar6 == 0) != uVar17);
LAB_001a1cef:
                operator_delete(local_60.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                super__Vector_impl_data._M_start);
              }
              pIVar8 = pIVar14->var;
            }
            else {
              aVar10._pt = (Clause *)0x0;
            }
            iVar4 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[0xe])
                              (pIVar8,(long)iVar3,aVar10._pt,1);
            if ((char)iVar4 == '\0') goto LAB_001a2131;
            pIVar8 = pIVar14->var;
            pIVar13 = (this->y).var;
          }
          iVar4 = (pIVar8->max).v;
          iVar3 = (pIVar13->max).v;
          if (iVar4 < iVar3) {
            if (so.lazy == true) {
              uVar5 = (this->b).v;
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,
                                     (uint)((int)sat.assigns.data[uVar5] - 1U < 0xfffffffd) +
                                     uVar5 * 2);
              iVar3 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[9])(pIVar8);
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(iVar3,local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                           _M_impl.super__Vector_impl_data._M_start._0_4_);
              iVar3 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                     .super__Vector_impl_data._M_finish._4_4_,iVar3);
              __l_05._M_len = 3;
              __l_05._M_array = (iterator)&local_128;
              std::vector<Lit,_std::allocator<Lit>_>::vector
                        (&local_78,__l_05,(allocator_type *)&local_130);
              pCVar7 = Reason_new(&local_78);
              if (local_78.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_78.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                super__Vector_impl_data._M_start);
              }
              pIVar13 = (this->y).var;
            }
            else {
              pCVar7 = (Clause *)0x0;
            }
            iVar4 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[0xf])
                              (pIVar13,(long)iVar4,pCVar7,1);
            if ((char)iVar4 == '\0') goto LAB_001a2131;
            pIVar13 = (this->y).var;
            iVar3 = (pIVar13->max).v;
            pIVar8 = pIVar14->var;
            iVar4 = (pIVar8->max).v;
          }
          if (iVar3 < iVar4) {
            if (so.lazy == true) {
              uVar5 = (this->b).v;
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,
                                     (uint)((int)sat.assigns.data[uVar5] - 1U < 0xfffffffd) +
                                     uVar5 * 2);
              iVar4 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[9])();
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(iVar4,local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                           _M_impl.super__Vector_impl_data._M_start._0_4_);
              iVar4 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
              local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                     .super__Vector_impl_data._M_finish._4_4_,iVar4);
              __l_06._M_len = 3;
              __l_06._M_array = (iterator)&local_128;
              std::vector<Lit,_std::allocator<Lit>_>::vector
                        (&local_90,__l_06,(allocator_type *)&local_130);
              pCVar7 = Reason_new(&local_90);
              if (local_90.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_90.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                super__Vector_impl_data._M_start);
              }
              pIVar8 = pIVar14->var;
            }
            else {
              pCVar7 = (Clause *)0x0;
            }
            iVar4 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[0xf])
                              (pIVar8,(long)iVar3,pCVar7,1);
            if ((char)iVar4 == '\0') goto LAB_001a2131;
            pIVar13 = (this->y).var;
            iVar3 = (pIVar13->max).v;
          }
          unaff_R15._a = 1;
          if (((pIVar13->min).v == iVar3) && ((pIVar14->var->min).v == (pIVar14->var->max).v)) {
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)&(this->super_Propagator).satisfied;
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)CONCAT44(1,(int)(this->super_Propagator).satisfied.v);
            vec<TrailElem>::push(&engine.trail,(TrailElem *)&local_128);
            (this->super_Propagator).satisfied.v = '\x01';
          }
          goto LAB_001a218e;
        }
        if (so.lazy) {
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (uint)(bVar1 < 0xfe) + uVar5 * 2);
          iVar3 = (*(pIVar14->var->super_Var).super_Branching._vptr_Branching[8])();
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(iVar3,local_128.super__Vector_base<Lit,_std::allocator<Lit>_>
                                             ._M_impl.super__Vector_impl_data._M_start._0_4_);
          iVar3 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                        _M_impl.super__Vector_impl_data._M_finish._4_4_,iVar3);
          __l._M_len = 3;
          __l._M_array = (iterator)&local_128;
          std::vector<Lit,_std::allocator<Lit>_>::vector(&local_48,__l,&local_131);
          iVar3 = (int)((ulong)((long)local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                      .super__Vector_impl_data._M_finish -
                               (long)local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                     super__Vector_impl_data._M_start) >> 2) + 1;
          local_130._pt = (Clause *)malloc((long)iVar3 * 4 + 8);
          *(uint *)local_130._pt = iVar3 * 0x100 | 2;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_130._pt);
          aVar10 = local_130;
          if ((long)local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                    super__Vector_impl_data._M_start == 0) {
            if (local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                super__Vector_impl_data._M_finish != (pointer)0x0) goto LAB_001a1b9c;
          }
          else {
            lVar6 = (long)local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2;
            uVar5 = *(uint *)local_130._pt;
            uVar17 = 0;
            do {
              if (((uVar5 >> 8) - 1) + (uint)(uVar5 >> 8 == 0) == uVar17) goto LAB_001a21ad;
              ((Clause *)(local_130._a + 8))->data[uVar17 - 1].x =
                   local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar17].x;
              uVar17 = uVar17 + 1;
            } while (lVar6 + (ulong)(lVar6 == 0) != uVar17);
LAB_001a1b9c:
            operator_delete(local_48.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          pIVar13 = (this->y).var;
        }
        else {
          aVar10._pt = (Clause *)0x0;
        }
        iVar4 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[0xe])
                          (pIVar13,(long)iVar4,aVar10._pt,1);
        if ((char)iVar4 != '\0') {
          pIVar13 = (this->y).var;
          iVar3 = (pIVar13->min).v;
          pIVar8 = pIVar14->var;
          iVar4 = (pIVar8->min).v;
          goto LAB_001a1bce;
        }
LAB_001a2131:
        unaff_R15._pt = (Clause *)0x0;
        goto LAB_001a218e;
      }
      pIVar13 = (this->y).var;
      if ((pIVar13->max).v < iVar4) {
        iVar4 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
        local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,iVar4);
        iVar4 = (*(pIVar14->var->super_Var).super_Branching._vptr_Branching[8])();
        local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(iVar4,local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                           _M_impl.super__Vector_impl_data._M_start._0_4_);
        iVar4 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
        local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                      _M_impl.super__Vector_impl_data._M_finish._4_4_,iVar4);
        __l_02._M_len = 3;
        __l_02._M_array = (iterator)&local_128;
        std::vector<Lit,_std::allocator<Lit>_>::vector(&local_a8,__l_02,&local_131);
        iVar4 = (int)((ulong)((long)local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2) + 1;
        local_130._pt = (Clause *)malloc((long)iVar4 * 4 + 8);
        *(uint *)local_130._pt = iVar4 * 0x100 | 2;
        vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_130._pt);
        if ((long)local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          lVar6 = (long)local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2;
          uVar5 = *(uint *)local_130._pt;
          uVar17 = 0;
          do {
            if (((uVar5 >> 8) - 1) + (uint)(uVar5 >> 8 == 0) == uVar17) goto LAB_001a21ad;
            ((Clause *)(local_130._a + 8))->data[uVar17 - 1].x =
                 local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar17].x;
            uVar17 = uVar17 + 1;
          } while (lVar6 + (ulong)(lVar6 == 0) != uVar17);
          goto LAB_001a1b8d;
        }
LAB_001a1b84:
        aVar10 = local_130;
        if (local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_finish != (pointer)0x0) goto LAB_001a1b8d;
      }
      else {
        unaff_R15._a = 1;
        if ((pIVar13->min).v <= (pIVar8->max).v) goto LAB_001a218e;
        iVar4 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
        local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                     .super__Vector_impl_data._M_start._4_4_,iVar4);
        iVar4 = (*(pIVar14->var->super_Var).super_Branching._vptr_Branching[9])();
        local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(iVar4,local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                           _M_impl.super__Vector_impl_data._M_start._0_4_);
        iVar4 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
        local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                      _M_impl.super__Vector_impl_data._M_finish._4_4_,iVar4);
        __l_03._M_len = 3;
        __l_03._M_array = (iterator)&local_128;
        std::vector<Lit,_std::allocator<Lit>_>::vector(&local_c0,__l_03,&local_131);
        iVar4 = (int)((ulong)((long)local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2) + 1;
        local_130._pt = (Clause *)malloc((long)iVar4 * 4 + 8);
        *(uint *)local_130._pt = iVar4 * 0x100 | 2;
        vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_130._pt);
        local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
        _M_start = local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if ((long)local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_start == 0) goto LAB_001a1b84;
        lVar6 = (long)local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2;
        uVar5 = *(uint *)local_130._pt;
        uVar17 = 0;
        do {
          if (((uVar5 >> 8) - 1) + (uint)(uVar5 >> 8 == 0) == uVar17) goto LAB_001a21ad;
          ((Clause *)(local_130._a + 8))->data[uVar17 - 1].x =
               local_c0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
               super__Vector_impl_data._M_start[uVar17].x;
          uVar17 = uVar17 + 1;
        } while (lVar6 + (ulong)(lVar6 == 0) != uVar17);
LAB_001a1b8d:
        aVar10 = local_130;
        operator_delete(local_a8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      goto LAB_001a2163;
    }
    iVar4 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
    aVar10._pt = (Clause *)((long)iVar4 * 4 + 2);
    p.x = ((this->b).s ^ 1) + (this->b).v * 2;
  }
  else {
    if ((uint)(this->b).s * 2 + -1 == (int)(char)bVar1) {
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&(this->super_Propagator).satisfied;
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)CONCAT44(1,(int)(this->super_Propagator).satisfied.v);
      vec<TrailElem>::push(&engine.trail,(TrailElem *)&local_128);
      (this->super_Propagator).satisfied.v = '\x01';
      unaff_R15._a = 1;
      goto LAB_001a218e;
    }
    if ((this->is_fixed).v != '\0') goto LAB_001a13c4;
    if ((this->a).sz != 0) {
      uVar17 = 0;
      do {
        lVar6 = uVar17 - (long)(this->x).b;
        pIVar8 = (this->x).var;
        if ((((pIVar8->min).v <= lVar6) && (lVar6 <= (pIVar8->max).v)) &&
           ((pIVar8->vals == (Tchar *)0x0 || (pIVar8->vals[lVar6].v != '\0')))) {
          pIVar14 = (this->a).data;
          if ((((this->y).var)->max).v < ((pIVar14[uVar17].var)->min).v) {
            uVar5 = (this->b).v;
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (uint)((int)sat.assigns.data[uVar5] - 1U < 0xfffffffd) +
                                         uVar5 * 2);
            iVar4 = (*((pIVar14[uVar17].var)->super_Var).super_Branching._vptr_Branching[8])();
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(iVar4,local_128.
                                               super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                               .super__Vector_impl_data._M_start._0_4_);
            iVar4 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                          _M_impl.super__Vector_impl_data._M_finish._4_4_,iVar4);
            __l_00._M_len = 3;
            __l_00._M_array = (iterator)&local_128;
            std::vector<Lit,_std::allocator<Lit>_>::vector(&local_d8,__l_00,&local_131);
            iVar4 = (int)((ulong)((long)local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                       _M_impl.super__Vector_impl_data._M_start) >> 2) + 1;
            local_130._pt = (Clause *)malloc((long)iVar4 * 4 + 8);
            *(uint *)local_130._pt = iVar4 * 0x100 | 2;
            vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_130._pt);
            aVar10 = local_130;
            if ((long)local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                      super__Vector_impl_data._M_start == 0) {
              if (local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) goto LAB_001a16a8;
            }
            else {
              lVar6 = (long)local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2;
              uVar5 = *(uint *)local_130._pt;
              uVar11 = 0;
              do {
                if (((uVar5 >> 8) - 1) + (uint)(uVar5 >> 8 == 0) == uVar11) goto LAB_001a21ad;
                ((Clause *)(local_130._a + 8))->data[uVar11 - 1].x =
                     local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar11].x;
                uVar11 = uVar11 + 1;
              } while (lVar6 + (ulong)(lVar6 == 0) != uVar11);
LAB_001a16a8:
              operator_delete(local_d8.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            lVar6 = uVar17 - (long)(this->x).b;
            pIVar8 = (this->x).var;
            if ((((pIVar8->min).v <= lVar6) && (lVar6 <= (pIVar8->max).v)) &&
               ((pIVar8->vals == (Tchar *)0x0 || (pIVar8->vals[lVar6].v != '\0')))) {
              unaff_R15._pt = (Clause *)0x0;
              if (so.lazy == false) {
                aVar10._pt = unaff_R15._pt;
              }
              iVar4 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[0x11])
                                (pIVar8,lVar6,aVar10._pt,1);
              if ((char)iVar4 == '\0') goto LAB_001a218e;
            }
          }
          pIVar14 = (this->a).data;
          if (((pIVar14[uVar17].var)->max).v < (((this->y).var)->min).v) {
            uVar5 = (this->b).v;
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (uint)((int)sat.assigns.data[uVar5] - 1U < 0xfffffffd) +
                                         uVar5 * 2);
            iVar4 = (*((pIVar14[uVar17].var)->super_Var).super_Branching._vptr_Branching[9])();
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)CONCAT44(iVar4,local_128.
                                               super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl
                                               .super__Vector_impl_data._M_start._0_4_);
            iVar4 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)CONCAT44(local_128.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                          _M_impl.super__Vector_impl_data._M_finish._4_4_,iVar4);
            __l_01._M_len = 3;
            __l_01._M_array = (iterator)&local_128;
            std::vector<Lit,_std::allocator<Lit>_>::vector(&local_f0,__l_01,&local_131);
            iVar4 = (int)((ulong)((long)local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>.
                                       _M_impl.super__Vector_impl_data._M_start) >> 2) + 1;
            local_130._pt = (Clause *)malloc((long)iVar4 * 4 + 8);
            *(uint *)local_130._pt = iVar4 * 0x100 | 2;
            vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_130._pt);
            aVar10 = local_130;
            if ((long)local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                      super__Vector_impl_data._M_start == 0) {
              if (local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) goto LAB_001a181c;
            }
            else {
              lVar6 = (long)local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2;
              uVar5 = *(uint *)local_130._pt;
              uVar11 = 0;
              do {
                if (((uVar5 >> 8) - 1) + (uint)(uVar5 >> 8 == 0) == uVar11) goto LAB_001a21ad;
                ((Clause *)(local_130._a + 8))->data[uVar11 - 1].x =
                     local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar11].x;
                uVar11 = uVar11 + 1;
              } while (lVar6 + (ulong)(lVar6 == 0) != uVar11);
LAB_001a181c:
              operator_delete(local_f0.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            lVar6 = uVar17 - (long)(this->x).b;
            pIVar8 = (this->x).var;
            if ((((pIVar8->min).v <= lVar6) && (lVar6 <= (pIVar8->max).v)) &&
               ((pIVar8->vals == (Tchar *)0x0 || (pIVar8->vals[lVar6].v != '\0')))) {
              unaff_R15._pt = (Clause *)0x0;
              if (so.lazy == false) {
                aVar10._pt = unaff_R15._pt;
              }
              iVar4 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[0x11])
                                (pIVar8,lVar6,aVar10._pt,1);
              if ((char)iVar4 == '\0') goto LAB_001a218e;
            }
          }
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 < (this->a).sz);
    }
LAB_001a1ae5:
    if (this->no_min_support != true) {
LAB_001a1fe1:
      unaff_R15._a = 1;
      if (this->no_max_support != true) goto LAB_001a218e;
      uVar17 = (ulong)(this->a).sz;
      if (uVar17 == 0) {
        iVar4 = -1;
        aVar10._a = 0xffffffff80000000;
      }
      else {
        pIVar8 = (this->x).var;
        pIVar14 = (this->a).data;
        lVar6 = -(long)(this->x).b;
        uVar11 = 0xffffffff;
        uVar15 = 0;
        aVar19._a = 0xffffffff80000000;
        do {
          if ((((pIVar8->min).v <= lVar6) && (lVar6 <= (pIVar8->max).v)) &&
             ((pIVar8->vals == (Tchar *)0x0 || (pIVar8->vals[lVar6].v != '\0')))) {
            iVar4 = (pIVar14->var->max).v;
            aVar10 = (anon_union_8_2_743a5d44_for_Reason_0)(long)iVar4;
            if ((long)aVar19._pt < (long)aVar10._pt) {
              if ((((this->y).var)->max).v <= iVar4) {
                iVar4 = (int)uVar15;
                break;
              }
              uVar11 = uVar15 & 0xffffffff;
              aVar19 = aVar10;
            }
          }
          aVar10 = aVar19;
          iVar4 = (int)uVar11;
          uVar15 = uVar15 + 1;
          lVar6 = lVar6 + 1;
          pIVar14 = pIVar14 + 1;
          aVar19 = aVar10;
        } while (uVar17 != uVar15);
      }
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&this->max_support;
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)CONCAT44(4,(this->max_support).v);
      local_130 = aVar10;
      vec<TrailElem>::push(&engine.trail,(TrailElem *)&local_128);
      (this->max_support).v = iVar4;
      pIVar8 = (this->y).var;
      if ((long)aVar10._pt < (long)(pIVar8->max).v) {
        local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)&local_130;
        if (sat.assigns.data[(uint)(this->b).v] == '\0') {
          if ((long)aVar10._pt < (long)(pIVar8->min).v) {
            local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)this;
            aVar10._pt = propagate::anon_class_16_2_f8370e7b::operator()
                                   ((anon_class_16_2_f8370e7b *)&local_128);
            uVar5 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
            goto LAB_001a2156;
          }
        }
        else {
          local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)this;
          pCVar7 = propagate::anon_class_16_2_f8370e7b::operator()
                             ((anon_class_16_2_f8370e7b *)&local_128);
          if (*(uint *)pCVar7 < 0x200) goto LAB_001a21ad;
          uVar5 = (this->b).v;
          *(uint *)(pCVar7 + 1) = (uint)((int)sat.assigns.data[uVar5] - 1U < 0xfffffffd) + uVar5 * 2
          ;
          pIVar8 = (this->y).var;
          iVar4 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[0xf])
                            (pIVar8,local_130._pt,pCVar7,1);
          if ((char)iVar4 == '\0') goto LAB_001a2131;
        }
      }
      this->no_max_support = false;
      goto LAB_001a218e;
    }
    aVar10._a = 0x7fffffffffffffff;
    local_130._a = 0x7fffffffffffffff;
    uVar17 = (ulong)(this->a).sz;
    if (uVar17 == 0) {
      iVar4 = -1;
    }
    else {
      pIVar8 = (this->x).var;
      pIVar14 = (this->a).data;
      lVar6 = -(long)(this->x).b;
      uVar11 = 0xffffffff;
      uVar15 = 0;
      do {
        if ((((pIVar8->min).v <= lVar6) && (lVar6 <= (pIVar8->max).v)) &&
           ((pIVar8->vals == (Tchar *)0x0 || (pIVar8->vals[lVar6].v != '\0')))) {
          iVar4 = (pIVar14->var->min).v;
          aVar19 = (anon_union_8_2_743a5d44_for_Reason_0)(long)iVar4;
          if ((long)aVar19._pt < (long)aVar10._pt) {
            local_130 = aVar19;
            if (iVar4 <= (((this->y).var)->min).v) {
              iVar4 = (int)uVar15;
              break;
            }
            uVar11 = uVar15 & 0xffffffff;
            aVar10 = aVar19;
          }
        }
        iVar4 = (int)uVar11;
        uVar15 = uVar15 + 1;
        lVar6 = lVar6 + 1;
        pIVar14 = pIVar14 + 1;
      } while (uVar17 != uVar15);
    }
    local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)&this->min_support;
    local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)CONCAT44(4,(this->min_support).v);
    vec<TrailElem>::push(&engine.trail,(TrailElem *)&local_128);
    (this->min_support).v = iVar4;
    pIVar8 = (this->y).var;
    if ((long)local_130._pt <= (long)(pIVar8->min).v) {
LAB_001a1fdd:
      this->no_min_support = false;
      goto LAB_001a1fe1;
    }
    local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)&local_130;
    if (sat.assigns.data[(uint)(this->b).v] != '\0') {
      local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)this;
      pCVar7 = propagate::anon_class_16_2_f8370e7b::operator()
                         ((anon_class_16_2_f8370e7b *)&local_128);
      if (*(uint *)pCVar7 < 0x200) goto LAB_001a21ad;
      uVar5 = (this->b).v;
      *(uint *)(pCVar7 + 1) = (uint)((int)sat.assigns.data[uVar5] - 1U < 0xfffffffd) + uVar5 * 2;
      pIVar8 = (this->y).var;
      iVar4 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[0xe])
                        (pIVar8,local_130._pt,pCVar7,1);
      if ((char)iVar4 == '\0') goto LAB_001a2131;
      goto LAB_001a1fdd;
    }
    if ((long)local_130._pt <= (long)(pIVar8->max).v) goto LAB_001a1fdd;
    local_128.super__Vector_base<Lit,_std::allocator<Lit>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)this;
    aVar10._pt = propagate::anon_class_16_2_f8370e7b::operator()
                           ((anon_class_16_2_f8370e7b *)&local_128);
    uVar5 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
LAB_001a2156:
    if (*(uint *)aVar10._pt < 0x200) {
LAB_001a21ad:
      abort();
    }
    *(uint *)(aVar10._a + 8) = uVar5;
LAB_001a2163:
    p.x = ((this->b).s ^ 1) + (this->b).v * 2;
  }
  SAT::cEnqueue(&sat,p,(Reason)aVar10);
  unaff_R15._a._1_7_ = 0;
  unaff_R15._a._0_1_ = sat.confl == (Clause *)0x0;
LAB_001a218e:
  return (bool)((byte)unaff_R15._a & 1);
}

Assistant:

bool propagate() override {
		if (b.isFixed() && b.isFalse()) {
			satisfied = true;
			return true;
		}

		// x is out of bounds
		if ((is_fixed != 0) && (fixed_index < 0 || fixed_index >= static_cast<int>(a.size()))) {
			return b.setVal(false, x.getValLit());
		}

		// y = a[fixed_index]
		if (is_fixed != 0) {
			assert(x.getVal() == fixed_index);
			const IntView<W>& f = a[fixed_index];
			if (b.isFixed()) {
				setDom(y, setMin, f.getMin(), Reason_new({b.getValLit(), f.getMinLit(), x.getValLit()}));
				setDom(f, setMin, y.getMin(), Reason_new({b.getValLit(), y.getMinLit(), x.getValLit()}));
				setDom(y, setMax, f.getMax(), Reason_new({b.getValLit(), f.getMaxLit(), x.getValLit()}));
				setDom(f, setMax, y.getMax(), Reason_new({b.getValLit(), y.getMaxLit(), x.getValLit()}));
				if (y.isFixed() && f.isFixed()) {
					satisfied = true;
				}
			} else if (f.getMin() > y.getMax()) {
				Clause* r = Reason_new({x.getValLit(), f.getMinLit(), y.getMaxLit()});
				return b.setVal(false, r);
			} else if (f.getMax() < y.getMin()) {
				Clause* r = Reason_new({x.getValLit(), f.getMaxLit(), y.getMinLit()});
				return b.setVal(false, r);
			}
			return true;
		}

		if (b.isFixed()) {
			for (unsigned int i = 0; i < a.size(); i++) {
				if (!x.indomain(i)) {
					continue;
				}
				if (y.getMax() < a[i].getMin()) {
					Clause* r = Reason_new({b.getValLit(), a[i].getMinLit(), y.getMaxLit()});
					setDom(x, remVal, i, r);
				}
				if (y.getMin() > a[i].getMax()) {
					Clause* r = Reason_new({b.getValLit(), a[i].getMaxLit(), y.getMinLit()});
					setDom(x, remVal, i, r);
				}
			}
		} else {
			std::vector<Lit> expl;
			bool push_min = false;
			bool push_max = false;
			unsigned int i = 0;
			while (i <= a.size()) {
				if (!x.indomain(i)) {
					expl.push_back(x.getLit(i, LR_EQ));
				} else if (y.getMax() < a[i].getMin()) {
					if (!push_max) {
						expl.push_back(y.getMaxLit());
						push_max = true;
					}
					expl.push_back(a[i].getMinLit());
				} else if (y.getMin() > a[i].getMax()) {
					if (!push_min) {
						expl.push_back(y.getMinLit());
						push_min = true;
					}
					expl.push_back(a[i].getMaxLit());
				} else {
					break;
				}
				i++;
			}
			if (i > x.getMax()) {
				Clause* r = Reason_new(expl);
				return b.setVal(false, r);
			}
		}

		if (no_min_support) {
			const int64_t old_m = y.getMin();
			int64_t new_m = INT64_MAX;
			int best = -1;
			for (unsigned int i = 0; i < a.size(); i++) {
				if (!x.indomain(i)) {
					continue;
				}
				const int64_t cur_m = a[i].getMin();
				if (cur_m < new_m) {
					best = i;
					new_m = cur_m;
					if (cur_m <= old_m) {
						break;
					}
				}
			}
			min_support = best;
			if (y.setMinNotR(new_m)) {
				auto reason = [&] {
					Clause* r = nullptr;
					if (so.lazy) {
						r = Reason_new(a.size() + 2);
						// Finesse lower bounds
						for (unsigned int i = 0; i < a.size(); i++) {
							(*r)[i + 2] = x.indomain(i) ? a[i].getFMinLit(new_m) : x.getLit(i, LR_EQ);
						}
					}
					return r;
				};
				if (b.isFixed()) {
					Clause* r = reason();
					(*r)[1] = b.getValLit();
					if (!y.setMin(new_m, r)) {
						return false;
					}
				} else if (y.getMax() < new_m) {
					Clause* r = reason();
					(*r)[1] = y.getMaxLit();
					return b.setVal(false, r);
				}
			}
			no_min_support = false;
		}

		if (no_max_support) {
			const int64_t old_m = y.getMax();
			int64_t new_m = INT_MIN;
			int best = -1;
			for (unsigned int i = 0; i < a.size(); i++) {
				if (!x.indomain(i)) {
					continue;
				}
				const int64_t cur_m = a[i].getMax();
				if (cur_m > new_m) {
					best = i;
					new_m = cur_m;
					if (cur_m >= old_m) {
						break;
					}
				}
			}
			max_support = best;
			if (y.setMaxNotR(new_m)) {
				auto reason = [&] {
					Clause* r = nullptr;
					if (so.lazy) {
						r = Reason_new(a.size() + 2);
						// Finesse upper bounds
						for (unsigned int i = 0; i < a.size(); i++) {
							(*r)[i + 2] = x.indomain(i) ? a[i].getFMaxLit(new_m) : x.getLit(i, LR_EQ);
						}
					}
					return r;
				};
				if (b.isFixed()) {
					Clause* r = reason();
					(*r)[1] = b.getValLit();
					if (!y.setMax(new_m, r)) {
						return false;
					}
				} else if (y.getMin() > new_m) {
					Clause* r = reason();
					(*r)[1] = y.getMinLit();
					return b.setVal(false, r);
				}
			}
			no_max_support = false;
		}

		return true;
	}